

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalNinjaGenerator::WriteNinjaRequiredVersion(cmLocalNinjaGenerator *this,ostream *os)

{
  undefined8 os_00;
  bool bVar1;
  cmGlobalNinjaGenerator *this_00;
  ostream *poVar2;
  void *this_01;
  allocator local_89;
  string local_88;
  string local_68 [48];
  string local_38 [8];
  string requiredVersion;
  ostream *os_local;
  cmLocalNinjaGenerator *this_local;
  
  requiredVersion.field_2._8_8_ = os;
  GetGlobalNinjaGenerator(this);
  cmGlobalNinjaGenerator::RequiredNinjaVersion_abi_cxx11_();
  this_00 = GetGlobalNinjaGenerator(this);
  bVar1 = cmGlobalNinjaGenerator::SupportsConsolePool(this_00);
  if (bVar1) {
    GetGlobalNinjaGenerator(this);
    cmGlobalNinjaGenerator::RequiredNinjaVersionForConsolePool_abi_cxx11_();
    std::__cxx11::string::operator=(local_38,local_68);
    std::__cxx11::string::~string(local_68);
  }
  os_00 = requiredVersion.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,"Minimal version of Ninja required by this file",&local_89);
  cmGlobalNinjaGenerator::WriteComment((ostream *)os_00,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  poVar2 = std::operator<<((ostream *)requiredVersion.field_2._8_8_,"ninja_required_version = ");
  poVar2 = std::operator<<(poVar2,local_38);
  this_01 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaRequiredVersion(std::ostream& os)
{
  // Default required version
  std::string requiredVersion =
      this->GetGlobalNinjaGenerator()->RequiredNinjaVersion();

  // Ninja generator uses the 'console' pool if available (>= 1.5)
  if(this->GetGlobalNinjaGenerator()->SupportsConsolePool())
    {
    requiredVersion =
      this->GetGlobalNinjaGenerator()->RequiredNinjaVersionForConsolePool();
    }

  cmGlobalNinjaGenerator::WriteComment(os,
                          "Minimal version of Ninja required by this file");
  os
    << "ninja_required_version = "
    << requiredVersion
    << std::endl << std::endl
    ;
}